

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.h
# Opt level: O0

void __thiscall TreeModel::TreeModel(TreeModel *this)

{
  TreeItem *this_00;
  UByteArray local_c8;
  UByteArray local_a8;
  UByteArray local_88;
  CBString local_68;
  CBString local_50;
  CBString local_28;
  TreeModel *local_10;
  TreeModel *this_local;
  
  this->markingEnabledFlag = false;
  this->markingDarkModeFlag = false;
  local_10 = this;
  this_00 = (TreeItem *)operator_new(0x118);
  Bstrlib::CBString::CBString(&local_28);
  Bstrlib::CBString::CBString(&local_50);
  Bstrlib::CBString::CBString(&local_68);
  UByteArray::UByteArray(&local_88);
  UByteArray::UByteArray(&local_a8);
  UByteArray::UByteArray(&local_c8);
  TreeItem::TreeItem(this_00,0,'<','\0',&local_28,&local_50,&local_68,&local_88,&local_a8,&local_c8,
                     true,false,(TreeItem *)0x0);
  this->rootItem = this_00;
  UByteArray::~UByteArray(&local_c8);
  UByteArray::~UByteArray(&local_a8);
  UByteArray::~UByteArray(&local_88);
  Bstrlib::CBString::~CBString(&local_68);
  Bstrlib::CBString::~CBString(&local_50);
  Bstrlib::CBString::~CBString(&local_28);
  return;
}

Assistant:

TreeModel() : markingEnabledFlag(false), markingDarkModeFlag(false) {
        rootItem = new TreeItem(0, Types::Root, 0, UString(), UString(), UString(), UByteArray(), UByteArray(), UByteArray(), true, false);
    }